

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationIdentifier.cpp
# Opt level: O1

KBOOL __thiscall
KDIS::DATA_TYPE::SimulationIdentifier::operator<
          (SimulationIdentifier *this,SimulationIdentifier *Value)

{
  uint uVar1;
  uint uVar2;
  
  uVar2._0_2_ = this->m_ui16SiteID;
  uVar2._2_2_ = this->m_ui16ApplicationID;
  uVar1._0_2_ = Value->m_ui16SiteID;
  uVar1._2_2_ = Value->m_ui16ApplicationID;
  return uVar2 < uVar1;
}

Assistant:

KBOOL SimulationIdentifier::operator <  ( const SimulationIdentifier & Value ) const
{
    // We will bit shift all fields into a single KUINT64, this will generate a new unique value which we can then use for comparison.
    // bits 0-15  = SiteID
    // bits 16-31 = ApplicationID
    // bits 32-63 = 0
    KUINT64 ui64ThisCmpVal = 0, ui64OtherCmpVal = 0;

    ui64ThisCmpVal = m_ui16SiteID | ( KUINT64 )m_ui16ApplicationID << 16;
    ui64OtherCmpVal = Value.m_ui16SiteID | ( KUINT64 )Value.m_ui16ApplicationID << 16;

    return ui64ThisCmpVal < ui64OtherCmpVal;
}